

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O1

void __thiscall Snes_Spc::reset_common(Snes_Spc *this,int timer_counter_init)

{
  uint8_t (*pauVar1) [16];
  
  (this->m).smp_regs[1][0xf] = (uint8_t)timer_counter_init;
  *(ushort *)((this->m).smp_regs[1] + 0xd) =
       (ushort)timer_counter_init & 0xff | (ushort)(timer_counter_init << 8);
  (this->m).cpu_regs.pc = 0;
  (this->m).cpu_regs.a = 0;
  (this->m).cpu_regs.x = 0;
  (this->m).cpu_regs.y = 0;
  (this->m).cpu_regs.psw = 0;
  (this->m).cpu_regs.sp = 0;
  (this->m).cpu_regs.pc = 0xffc0;
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 0) = '\n';
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 1) = 0xb0;
  pauVar1 = (this->m).smp_regs;
  *(uint8_t *)((long)(pauVar1 + 1) + 4) = '\0';
  *(uint8_t *)((long)(pauVar1 + 1) + 5) = '\0';
  *(uint8_t *)((long)(pauVar1 + 1) + 6) = '\0';
  *(uint8_t *)((long)(pauVar1 + 1) + 7) = '\0';
  reset_time_regs(this);
  return;
}

Assistant:

void Snes_Spc::reset_common( int timer_counter_init )
{
	int i;
	for ( i = 0; i < timer_count; i++ )
		REGS_IN [r_t0out + i] = timer_counter_init;
	
	// Run IPL ROM
	memset( &m.cpu_regs, 0, sizeof m.cpu_regs );
	m.cpu_regs.pc = rom_addr;
	
	REGS [r_test   ] = 0x0A;
	REGS [r_control] = 0xB0; // ROM enabled, clear ports
	for ( i = 0; i < port_count; i++ )
		REGS_IN [r_cpuio0 + i] = 0;
	
	reset_time_regs();
}